

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.h
# Opt level: O0

bool __thiscall
skiwi::environment<skiwi::alpha_conversion_data>::find
          (environment<skiwi::alpha_conversion_data> *this,alpha_conversion_data *e,string *name)

{
  bool bVar1;
  element_type *peVar2;
  pointer ppVar3;
  _Self local_68 [3];
  _Base_ptr local_50;
  undefined1 local_48 [8];
  shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_> p_outer_copy;
  _Self local_30;
  iterator it;
  string *name_local;
  alpha_conversion_data *e_local;
  environment<skiwi::alpha_conversion_data> *this_local;
  
  it._M_node = (_Base_ptr)name;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::alpha_conversion_data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::alpha_conversion_data>_>_>
       ::find(&this->env,name);
  p_outer_copy.
  super___shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::alpha_conversion_data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::alpha_conversion_data>_>_>
       ::end(&this->env);
  bVar1 = std::operator!=(&local_30,
                          (_Self *)&p_outer_copy.
                                    super___shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
  if (bVar1) {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::alpha_conversion_data>_>
             ::operator->(&local_30);
    alpha_conversion_data::operator=(e,&ppVar3->second);
    this_local._7_1_ = true;
  }
  else {
    std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>::shared_ptr
              ((shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_> *)local_48,
               &this->p_outer);
    while( true ) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_48);
      if (!bVar1) break;
      peVar2 = std::
               __shared_ptr_access<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_48);
      local_50 = (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::alpha_conversion_data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::alpha_conversion_data>_>_>
                 ::find(&peVar2->env,it._M_node);
      local_30._M_node = local_50;
      peVar2 = std::
               __shared_ptr_access<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_48);
      local_68[0]._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::alpha_conversion_data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::alpha_conversion_data>_>_>
           ::end(&peVar2->env);
      bVar1 = std::operator!=(&local_30,local_68);
      if (bVar1) {
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::alpha_conversion_data>_>
                 ::operator->(&local_30);
        alpha_conversion_data::operator=(e,&ppVar3->second);
        this_local._7_1_ = true;
        goto LAB_0034836c;
      }
      peVar2 = std::
               __shared_ptr_access<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_48);
      std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>::operator=
                ((shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_> *)local_48,
                 &peVar2->p_outer);
    }
    this_local._7_1_ = false;
LAB_0034836c:
    std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>::~shared_ptr
              ((shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_> *)local_48);
  }
  return this_local._7_1_;
}

Assistant:

bool find(TEntry& e, const std::string& name)
      {
      auto it = env.find(name);
      if (it != env.end())
        {
        e = it->second;
        return true;
        }
      auto p_outer_copy = p_outer;
      while (p_outer_copy)
        {
        it = p_outer_copy->env.find(name);
        if (it != p_outer_copy->env.end())
          {
          e = it->second;
          return true;
          }
        p_outer_copy = p_outer_copy->p_outer;
        }
      return false;
      }